

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

bool __thiscall
pybind11::detail::argument_loader<char_const*,Double&,Double&,bool,ImVec4_const&,float>::
load_impl_sequence<0ul,1ul,2ul,3ul,4ul,5ul>
          (argument_loader<char_const*,Double&,Double&,bool,ImVec4_const&,float> *this,long call)

{
  handle src;
  bool bVar1;
  
  src.m_ptr = (PyObject *)**(undefined8 **)(call + 8);
  if (src.m_ptr != (PyObject *)0x0) {
    if (src.m_ptr == (PyObject *)&_Py_NoneStruct) {
      if ((**(ulong **)(call + 0x20) & 1) == 0) {
        return false;
      }
      this[0x78] = (argument_loader<char_const*,Double&,Double&,bool,ImVec4_const&,float>)0x1;
    }
    else {
      bVar1 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ::load((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      *)(this + 0x58),src,(bool)((byte)**(ulong **)(call + 0x20) & 1));
      if (!bVar1) {
        return false;
      }
    }
    bVar1 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                      ((type_caster_generic *)(this + 0x40),*(PyObject **)(*(long *)(call + 8) + 8),
                       SUB41((**(uint **)(call + 0x20) & 2) >> 1,0));
    if ((((bVar1) &&
         (bVar1 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                            ((type_caster_generic *)(this + 0x28),
                             *(PyObject **)(*(long *)(call + 8) + 0x10),
                             SUB41((**(uint **)(call + 0x20) & 4) >> 2,0)), bVar1)) &&
        (bVar1 = type_caster<bool,_void>::load
                           ((type_caster<bool,_void> *)(this + 0x20),
                            *(PyObject **)(*(long *)(call + 8) + 0x18),
                            SUB41((**(uint **)(call + 0x20) & 8) >> 3,0)), bVar1)) &&
       (bVar1 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                          ((type_caster_generic *)(this + 8),
                           *(PyObject **)(*(long *)(call + 8) + 0x20),
                           SUB41((**(uint **)(call + 0x20) & 0x10) >> 4,0)), bVar1)) {
      bVar1 = type_caster<float,_void>::load
                        ((type_caster<float,_void> *)this,*(PyObject **)(*(long *)(call + 8) + 0x28)
                         ,SUB41((**(uint **)(call + 0x20) & 0x20) >> 5,0));
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }